

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImageExtractor.cpp
# Opt level: O2

int SaveAsTGA(FILE *file,aiTexel *data,uint width,uint height)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  aiTexel *__ptr;
  ulong uVar4;
  bool bVar5;
  undefined8 local_48;
  undefined4 local_40;
  undefined2 local_3c;
  undefined2 local_3a;
  undefined2 local_38;
  
  if (data == (aiTexel *)0x0 || file == (FILE *)0x0) {
    iVar1 = 1;
  }
  else {
    local_40 = 0;
    local_38 = 0x2020;
    local_3a = (undefined2)height;
    local_3c = (undefined2)width;
    local_48 = 0x20000;
    fwrite(&local_48,0x12,1,(FILE *)file);
    uVar2 = 0;
    for (uVar4 = 0; uVar4 != height; uVar4 = uVar4 + 1) {
      __ptr = data + uVar2;
      uVar3 = (ulong)width;
      while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
        fwrite(__ptr,4,1,(FILE *)file);
        __ptr = __ptr + 1;
      }
      uVar2 = (ulong)((int)uVar2 + width);
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int SaveAsTGA (FILE* file, const aiTexel* data, unsigned int width, unsigned int height)
{
    if (!file || !data) {
        return 1;
    }

    TGA_HEADER head;
    memset(&head, 0, sizeof(head));
    head.bits   = 32;
    head.height = (uint16_t)height;
    head.width  = (uint16_t)width;
    head.descriptor |= (1u<<5);

    head.imagetype = 2; // actually it's RGBA
    fwrite(&head,sizeof(TGA_HEADER),1,file);

    for (unsigned int y = 0; y < height; ++y) {
        for (unsigned int x = 0; x < width; ++x) {
            fwrite(data + y*width+x,4,1,file);
        }
    }

    return 0;
}